

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

LY_ERR lys_compile_uses_children
                 (lysc_ctx *ctx,lysp_node_uses *uses_p,uint16_t inherited_flags,lysp_node *child,
                 lysp_module *grp_mod,lysc_node *parent,ly_set *child_set,
                 ly_bool child_unres_disabled)

{
  lysp_when *when_p;
  lysc_node *parent_00;
  uint16_t inherited_flags_00;
  lysp_node_uses *ctx_00;
  lysc_node *ctx_node;
  lysc_when *local_70;
  lysc_when *when_shared;
  lysc_node *node;
  lysp_node *pnode;
  uint32_t local_50;
  uint32_t uStack_4c;
  ly_bool enabled;
  uint32_t opt_prev;
  uint32_t child_i;
  lysp_module *mod_old;
  lysc_node *plStack_38;
  LY_ERR rc;
  lysc_node *parent_local;
  lysp_module *grp_mod_local;
  lysp_node *child_local;
  lysp_node_uses *plStack_18;
  uint16_t inherited_flags_local;
  lysp_node_uses *uses_p_local;
  lysc_ctx *ctx_local;
  
  mod_old._4_4_ = LY_SUCCESS;
  _opt_prev = ctx->pmod;
  local_50 = ctx->compile_opts;
  local_70 = (lysc_when *)0x0;
  plStack_38 = parent;
  parent_local = (lysc_node *)grp_mod;
  grp_mod_local = (lysp_module *)child;
  child_local._6_2_ = inherited_flags;
  plStack_18 = uses_p;
  uses_p_local = (lysp_node_uses *)ctx;
  if (child_set == (ly_set *)0x0) {
    __assert_fail("child_set",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                  ,0xf71,
                  "LY_ERR lys_compile_uses_children(struct lysc_ctx *, struct lysp_node_uses *, uint16_t, struct lysp_node *, struct lysp_module *, struct lysc_node *, struct ly_set *, ly_bool)"
                 );
  }
  uStack_4c = child_set->count;
  for (node = (lysc_node *)child; node != (lysc_node *)0x0; node = node->parent) {
    (uses_p_local->field_0).node.next = (lysp_node *)parent_local;
    mod_old._4_4_ =
         lys_compile_node((lysc_ctx *)uses_p_local,(lysp_node *)node,plStack_38,child_local._6_2_,
                          child_set);
    if ((mod_old._4_4_ != LY_SUCCESS) ||
       (mod_old._4_4_ =
             lys_eval_iffeatures((ly_ctx *)(uses_p_local->field_0).node.parent,
                                 (lysp_qname *)node->dsc,(ly_bool *)((long)&pnode + 7)),
       mod_old._4_4_ != LY_SUCCESS)) break;
    if ((pnode._7_1_ == '\0') && ((*(uint *)((long)&uses_p_local[1].field_0 + 0x34) & 0xb) == 0)) {
      *(uint *)((long)&uses_p_local[1].field_0 + 0x34) =
           *(uint *)((long)&uses_p_local[1].field_0 + 0x34) | 2;
    }
    (uses_p_local->field_0).node.next = (lysp_node *)_opt_prev;
    for (; ctx_00 = uses_p_local, inherited_flags_00 = child_local._6_2_, parent_00 = plStack_38,
        uStack_4c < child_set->count; uStack_4c = uStack_4c + 1) {
      when_shared = (lysc_when *)(child_set->field_2).dnodes[uStack_4c];
      if (plStack_18->when != (lysp_when *)0x0) {
        when_p = plStack_18->when;
        ctx_node = lysc_data_node(plStack_38);
        mod_old._4_4_ =
             lys_compile_when((lysc_ctx *)ctx_00,when_p,inherited_flags_00,parent_00,ctx_node,
                              (lysc_node *)when_shared,&local_70);
        if (mod_old._4_4_ != LY_SUCCESS) goto LAB_00178245;
      }
      if (child_unres_disabled != '\0') {
        ly_set_add((ly_set *)(uses_p_local[1].field_0.node.ref + 0x40),when_shared,'\x01',
                   (uint32_t *)0x0);
      }
    }
    *(uint32_t *)((long)&uses_p_local[1].field_0 + 0x34) = local_50;
  }
LAB_00178245:
  *(uint32_t *)((long)&uses_p_local[1].field_0 + 0x34) = local_50;
  return mod_old._4_4_;
}

Assistant:

static LY_ERR
lys_compile_uses_children(struct lysc_ctx *ctx, struct lysp_node_uses *uses_p, uint16_t inherited_flags,
        struct lysp_node *child, struct lysp_module *grp_mod, struct lysc_node *parent, struct ly_set *child_set,
        ly_bool child_unres_disabled)
{
    LY_ERR rc = LY_SUCCESS;
    struct lysp_module *mod_old = ctx->pmod;
    uint32_t child_i, opt_prev = ctx->compile_opts;
    ly_bool enabled;
    struct lysp_node *pnode;
    struct lysc_node *node;
    struct lysc_when *when_shared = NULL;

    assert(child_set);

    child_i = child_set->count;
    LY_LIST_FOR(child, pnode) {
        /* compile the nodes with their parsed (grouping) module */
        ctx->pmod = grp_mod;
        LY_CHECK_GOTO(rc = lys_compile_node(ctx, pnode, parent, inherited_flags, child_set), cleanup);

        /* eval if-features again for the rest of this node processing */
        LY_CHECK_GOTO(rc = lys_eval_iffeatures(ctx->ctx, pnode->iffeatures, &enabled), cleanup);
        if (!enabled && !(ctx->compile_opts & (LYS_COMPILE_NO_DISABLED | LYS_COMPILE_DISABLED | LYS_COMPILE_GROUPING))) {
            ctx->compile_opts |= LYS_COMPILE_DISABLED;
        }

        /* restore the parsed module */
        ctx->pmod = mod_old;

        /* since the uses node is not present in the compiled tree, we need to pass some of its
         * statements to all its children */
        while (child_i < child_set->count) {
            node = child_set->snodes[child_i];

            if (uses_p->when) {
                /* pass uses when to all the children */
                rc = lys_compile_when(ctx, uses_p->when, inherited_flags, parent, lysc_data_node(parent), node, &when_shared);
                LY_CHECK_GOTO(rc, cleanup);
            }

            if (child_unres_disabled) {
                /* child is disabled by the uses if-features */
                ly_set_add(&ctx->unres->disabled, node, 1, NULL);
            }

            /* child processed */
            ++child_i;
        }

        /* next iter */
        ctx->compile_opts = opt_prev;
    }

cleanup:
    ctx->compile_opts = opt_prev;
    return rc;
}